

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<96U,_unsigned_short,_void,_false>::eval_divide_knuth
          (uintwide_t<96U,_unsigned_short,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other,
          uintwide_t<24U,_unsigned_char,_void,_false> *remainder)

{
  value_type_conflict4 *pvVar1;
  int_fast8_t iVar2;
  enable_if_t<(_false),_uintwide_t<96U,_unsigned_short>_> eVar3;
  unsigned_fast_type uVar4;
  undefined5 extraout_var;
  long lVar5;
  undefined4 extraout_EDX;
  unsigned_fast_type u_offset;
  undefined8 local_34;
  undefined4 local_2c;
  
  uVar4 = 0;
  for (lVar5 = 0xc;
      (u_offset = 6, lVar5 != 0 && (u_offset = uVar4, *(short *)(this + lVar5 + -2) == 0));
      lVar5 = lVar5 + -2) {
    uVar4 = uVar4 + 1;
  }
  lVar5 = 0xc;
  uVar4 = 0;
  do {
    if (lVar5 == 0) {
LAB_0014631a:
      eVar3 = limits_helper_max<false>();
      *(ulong *)this = CONCAT53(extraout_var,eVar3.values.super_array<unsigned_char,_3UL>.elems);
      *(undefined4 *)(this + 8) = extraout_EDX;
      if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
        for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 2) {
          pvVar1 = (remainder->values).super_array<unsigned_char,_3UL>.elems + lVar5;
          pvVar1[0] = '\0';
          pvVar1[1] = '\0';
        }
      }
      return;
    }
    if (*(short *)((other->values).super_array<unsigned_char,_3UL>.elems + lVar5 + -2) != 0) {
      if (lVar5 != 0) {
        if (u_offset != 6) {
          iVar2 = compare<false,_nullptr>((uintwide_t<24U,_unsigned_char,_void,_false> *)this,other)
          ;
          if (iVar2 != '\0') {
            if (iVar2 == -1) {
              if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
                *(undefined4 *)(remainder[2].values.super_array<unsigned_char,_3UL>.elems + 2) =
                     *(undefined4 *)(this + 8);
                *(undefined8 *)remainder = *(undefined8 *)this;
              }
              uintwide_t<96u,unsigned_short,void,false>::uintwide_t<unsigned_char>(unsigned_char,std
              ::enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
              value)&&(std::numeric_limits<unsigned_char>::digits<=std::
              numeric_limits<unsigned_short>::digits),void>::type__
                        (&local_34,'\0',
                         (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                          *)0x0);
              *(undefined4 *)(this + 8) = local_2c;
              *(undefined8 *)this = local_34;
              return;
            }
            void_math::wide_integer::uintwide_t<96u,unsigned_short,void,false>::
            eval_divide_knuth_core<96u>(unsigned_long,unsigned_long,math::wide_integer::
            uintwide_t<96u,unsigned_short,void,false>const&,math::wide_integer::
            uintwide_t<96u,unsigned_short,void,false>*,std::
            enable_if<((96u)>(static_cast<unsigned_int>(std::numeric_limits<unsigned_short>::
            digits))),int>::type__
                      (this,u_offset,uVar4,other,remainder,
                       (enable_if_t<(96U_>_static_cast<size_t>_std__numeric_limits<limb_type>__digits____int>
                        *)0x0);
            return;
          }
          uintwide_t<96u,unsigned_short,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
          enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
          value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_short>::
          digits),void>::type__
                    (&local_34,'\x01',
                     (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                      *)0x0);
          *(undefined4 *)(this + 8) = local_2c;
          *(undefined8 *)this = local_34;
        }
        if (remainder == (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
          return;
        }
        uintwide_t<96u,unsigned_short,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
        enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
        value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_short>::
        digits),void>::type__
                  (&local_34,'\0',
                   (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                    *)0x0);
        *(undefined4 *)(remainder[2].values.super_array<unsigned_char,_3UL>.elems + 2) = local_2c;
        *(undefined8 *)remainder = local_34;
        return;
      }
      goto LAB_0014631a;
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + -2;
  } while( true );
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }